

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackDebGenerator::createDbgsymDDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *logger;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues_00;
  string shLibsFilename;
  bool bVar1;
  string *psVar2;
  mapped_type *pmVar3;
  string *__lhs;
  cmValue cVar4;
  cmValue numThreads;
  cmValue debianArchiveType;
  undefined8 uVar5;
  allocator<char> in_stack_fffffffffffffb98;
  string in_stack_fffffffffffffba0;
  allocator<char> in_stack_fffffffffffffbc0;
  allocator<char> local_43f;
  allocator<char> local_43e;
  allocator<char> local_43d;
  allocator<char> local_43c;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439;
  string in_stack_fffffffffffffbc8;
  cmValue in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbf0;
  undefined1 auStack_408 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  cmValue local_3a8;
  key_type local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string packageNameLower;
  DebGenerator gen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator<char> *)&stack0xfffffffffffffb98);
  psVar2 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  cmsys::SystemTools::LowerCase(&packageNameLower,psVar2);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",
             (allocator<char> *)&stack0xfffffffffffffb98);
  psVar2 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 &packageNameLower,"-dbgsym");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb98,"Package",
             (allocator<char> *)&stack0xfffffffffffffbc8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffb98);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Package-Type",(allocator<char> *)&stack0xfffffffffffffb98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Version",(allocator<char> *)&stack0xfffffffffffffb98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Auto-Built-Package",(allocator<char> *)&stack0xfffffffffffffb98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbe8,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator<char> *)&local_340);
  __lhs = (string *)
          cmCPackGenerator::GetOption
                    (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffbe8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8," (= ",(allocator<char> *)&local_360);
  if (__lhs == (string *)0x0) {
    __lhs = &cmValue::Empty_abi_cxx11_;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbc8,__lhs,&local_3c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffb98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffbc8,psVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffb98,")");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Depends",(allocator<char> *)&local_380);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&local_3a0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbe8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Section",(allocator<char> *)&stack0xfffffffffffffb98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"Priority",(allocator<char> *)&stack0xfffffffffffffb98);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&gen);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator<char> *)&stack0xfffffffffffffbc8);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb98,"Architecture",
             (allocator<char> *)&stack0xfffffffffffffbe8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffb98);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",
             (allocator<char> *)&stack0xfffffffffffffbc8);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb98,"Maintainer",
             (allocator<char> *)&stack0xfffffffffffffbe8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffb98);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb98,"debug symbols for ",
             (allocator<char> *)&stack0xfffffffffffffbe8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffb98,&packageNameLower);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbc8,"Description",(allocator<char> *)&local_3c8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,(key_type *)&stack0xfffffffffffffbc8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc8);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",
             (allocator<char> *)&stack0xfffffffffffffb98);
  cVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Source",(allocator<char> *)&stack0xfffffffffffffb98);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_BUILD_IDS",(allocator<char> *)&stack0xfffffffffffffb98);
  cVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Build-Ids",(allocator<char> *)&stack0xfffffffffffffb98);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb98,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",&local_439);
  psVar2 = (string *)
           cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffb98);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_80,(string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbc8,"GEN_DBGSYMDIR",&local_43a);
  psVar2 = (string *)
           cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffbc8);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbe8,"CPACK_TOPLEVEL_DIRECTORY",&local_43b);
  psVar2 = (string *)
           cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&stack0xfffffffffffffbe8);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"CPACK_TEMPORARY_DIRECTORY",&local_43c);
  psVar2 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3c8);
  if (psVar2 == (string *)0x0) {
    psVar2 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_e0,(string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",&local_43d);
  cVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"CPACK_THREADS",&local_43e);
  numThreads = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE",&local_43f);
  debianArchiveType = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_360);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"",(allocator<char> *)&stack0xfffffffffffffbc0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"",(allocator<char> *)&stack0xfffffffffffffbbf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"",(allocator<char> *)&stack0xfffffffffffffbbe);
  local_3a8 = cVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",
             (allocator<char> *)&stack0xfffffffffffffbbd);
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_380);
  uVar5 = 0x1bde5b;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158,&this->packageFiles);
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  controlValues_00._M_t._M_impl._0_8_ = &local_60;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_100;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_120;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shLibsFilename.field_2._M_allocated_capacity = (size_type)&local_158;
  shLibsFilename._M_dataplus._M_p = (pointer)SUB168(ZEXT116(bVar1) << 0x40,0);
  shLibsFilename._M_string_length = SUB168(ZEXT116(bVar1) << 0x40,8);
  shLibsFilename.field_2._8_8_ = uVar5;
  anon_unknown.dwarf_179e6c::DebGenerator::DebGenerator
            (&gen,logger,&local_80,&local_a0,&local_c0,&local_e0,local_3a8,numThreads,
             debianArchiveType,controlValues_00,SUB81(local_140,0),shLibsFilename,
             (bool)in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,
             (bool)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbe8,
             (bool)in_stack_fffffffffffffbf0,_auStack_408);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbe8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb98);
  bVar1 = anon_unknown.dwarf_179e6c::DebGenerator::generate(&gen);
  anon_unknown.dwarf_179e6c::DebGenerator::~DebGenerator(&gen);
  std::__cxx11::string::~string((string *)&packageNameLower);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return bVar1;
}

Assistant:

bool cmCPackDebGenerator::createDbgsymDDeb()
{
  // Packages containing debug symbols follow the same structure as .debs
  // but have different metadata and content.

  std::map<std::string, std::string> controlValues;
  // debian policy enforce lower case for package name
  std::string packageNameLower = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  cmValue debian_pkg_version =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");

  controlValues["Package"] = packageNameLower + "-dbgsym";
  controlValues["Package-Type"] = "ddeb";
  controlValues["Version"] = *debian_pkg_version;
  controlValues["Auto-Built-Package"] = "debug-symbols";
  controlValues["Depends"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") + std::string(" (= ") +
    *debian_pkg_version + ")";
  controlValues["Section"] = "debug";
  controlValues["Priority"] = "optional";
  controlValues["Architecture"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    std::string("debug symbols for ") + packageNameLower;

  cmValue debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (cmNonempty(debian_pkg_source)) {
    controlValues["Source"] = *debian_pkg_source;
  }
  cmValue debian_build_ids = this->GetOption("GEN_BUILD_IDS");
  if (cmNonempty(debian_build_ids)) {
    controlValues["Build-Ids"] = *debian_build_ids;
  }

  DebGenerator gen(
    this->Logger, this->GetOption("GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME"),
    this->GetOption("GEN_DBGSYMDIR"),
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("CPACK_THREADS"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, false, "",
    false, "", false, "", nullptr,
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    this->packageFiles);

  return gen.generate();
}